

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_io.c
# Opt level: O0

void vinlet_dspprolog(_vinlet *x,t_signal **parentsigs,int myvecsize,int calcsize,int phase,
                     int period,int frequency,int downsample,int upsample,int reblock,int switched)

{
  uint uVar1;
  int iVar2;
  t_sample *__s;
  uint local_6c;
  t_sample *local_68;
  int method;
  t_sample *buf;
  int re_parentvecsize;
  int prologphase;
  int oldbufsize;
  int bufsize;
  int parentvecsize;
  t_signal *insig;
  int period_local;
  int phase_local;
  int calcsize_local;
  int myvecsize_local;
  t_signal **parentsigs_local;
  _vinlet *x_local;
  
  if (x->x_buf != (t_sample *)0x0) {
    (x->x_updown).downsample = downsample;
    (x->x_updown).upsample = upsample;
    if (reblock == 0) {
      iVar2 = inlet_getsignalindex(x->x_inlet);
      x->x_directsignal = parentsigs[iVar2];
    }
    else if (x->x_buf != (t_sample *)0x0) {
      uVar1 = phase - 1U & period - 1U;
      if (parentsigs == (t_signal **)0x0) {
        _bufsize = (t_signal *)0x0;
        oldbufsize = 1;
        buf._4_4_ = 1;
      }
      else {
        iVar2 = inlet_getsignalindex(x->x_inlet);
        _bufsize = parentsigs[iVar2];
        oldbufsize = _bufsize->s_vecsize;
        buf._4_4_ = (oldbufsize * upsample) / downsample;
      }
      prologphase = buf._4_4_;
      if (buf._4_4_ < myvecsize) {
        prologphase = myvecsize;
      }
      if (prologphase != x->x_bufsize) {
        freebytes(x->x_buf,(long)x->x_bufsize << 2);
        __s = (t_sample *)getbytes((long)prologphase << 2);
        memset(__s,0,(long)prologphase << 2);
        x->x_bufsize = prologphase;
        x->x_endbuf = __s + prologphase;
        x->x_buf = __s;
      }
      if (parentsigs == (t_signal **)0x0) {
        memset(x->x_buf,0,(long)prologphase << 2);
      }
      else {
        x->x_hop = period * buf._4_4_;
        if (uVar1 == 0) {
          local_68 = x->x_endbuf;
        }
        else {
          local_68 = x->x_endbuf + -(long)(int)(x->x_hop - uVar1 * buf._4_4_);
        }
        x->x_fill = local_68;
        if (upsample * downsample == 1) {
          dsp_add(vinlet_doprolog,3,x,_bufsize->s_vec,(long)buf._4_4_);
        }
        else {
          if ((x->x_updown).method == -1) {
            local_6c = (uint)(0x2b < pd_compatibilitylevel);
          }
          else {
            local_6c = (x->x_updown).method;
          }
          resamplefrom_dsp(&x->x_updown,_bufsize->s_vec,oldbufsize,buf._4_4_,local_6c);
          dsp_add(vinlet_doprolog,3,x,(x->x_updown).s_vec,(long)buf._4_4_);
        }
        if (_bufsize->s_refcount == 0) {
          signal_makereusable(_bufsize);
        }
      }
      x->x_directsignal = (t_signal *)0x0;
    }
  }
  return;
}

Assistant:

void vinlet_dspprolog(struct _vinlet *x, t_signal **parentsigs,
    int myvecsize, int calcsize, int phase, int period, int frequency,
    int downsample, int upsample,  int reblock, int switched)
{
    t_signal *insig;
        /* no buffer means we're not a signal inlet */
    if (!x->x_buf)
        return;
    x->x_updown.downsample = downsample;
    x->x_updown.upsample   = upsample;

        /* if the "reblock" flag is set, arrange to copy data in from the
        parent. */
    if (reblock)
    {
        int parentvecsize, bufsize, oldbufsize, prologphase;
        int re_parentvecsize; /* resampled parentvectorsize */
            /* this should never happen: */
        if (!x->x_buf) return;

            /* the prolog code counts from 0 to period-1; the
            phase is backed up by one so that AFTER the prolog code
            runs, the "x_fill" phase is in sync with the "x_read" phase. */
        prologphase = (phase - 1) & (period - 1);
        if (parentsigs)
        {
            insig = parentsigs[inlet_getsignalindex(x->x_inlet)];
            parentvecsize = insig->s_vecsize;
            re_parentvecsize = parentvecsize * upsample / downsample;
        }
        else
        {
            insig = 0;
            parentvecsize = 1;
            re_parentvecsize = 1;
        }

        bufsize = re_parentvecsize;
        if (bufsize < myvecsize) bufsize = myvecsize;
        if (bufsize != (oldbufsize = x->x_bufsize))
        {
            t_sample *buf = x->x_buf;
            t_freebytes(buf, oldbufsize * sizeof(*buf));
            buf = (t_sample *)t_getbytes(bufsize * sizeof(*buf));
            memset((char *)buf, 0, bufsize * sizeof(*buf));
            x->x_bufsize = bufsize;
            x->x_endbuf = buf + bufsize;
            x->x_buf = buf;
        }
        if (parentsigs)
        {
            x->x_hop = period * re_parentvecsize;

            x->x_fill = prologphase ?
                x->x_endbuf - (x->x_hop - prologphase * re_parentvecsize) :
                    x->x_endbuf;

            if (upsample * downsample == 1)
                    dsp_add(vinlet_doprolog, 3, x, insig->s_vec,
                        (t_int)re_parentvecsize);
            else {
              int method = (x->x_updown.method == -1?
                  (pd_compatibilitylevel < 44 ? 0 : 1) : x->x_updown.method);
              resamplefrom_dsp(&x->x_updown, insig->s_vec, parentvecsize,
                  re_parentvecsize, method);
              dsp_add(vinlet_doprolog, 3, x, x->x_updown.s_vec,
                  (t_int)re_parentvecsize);
        }

            /* if the input signal's reference count is zero, we have
               to free it here because we didn't in ugen_doit(). */
            if (!insig->s_refcount)
                signal_makereusable(insig);
        }
        else memset((char *)(x->x_buf), 0, bufsize * sizeof(*x->x_buf));
        x->x_directsignal = 0;
    }
    else
    {
            /* no reblocking; in this case our output signal is "borrowed"
            and merely needs to be pointed to the real one. */
        x->x_directsignal = parentsigs[inlet_getsignalindex(x->x_inlet)];
    }
}